

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-object.c
# Opt level: O0

void item_menu_browser(wchar_t oid,void *data,region_conflict *param_3)

{
  wchar_t wVar1;
  char *pcVar2;
  bool bVar3;
  wchar_t local_b0;
  wchar_t local_a4;
  wchar_t local_9c;
  char letter;
  char *fmt;
  wchar_t quiver_slots;
  wchar_t i;
  wchar_t j;
  wchar_t count;
  char tmp_val [80];
  region_conflict *local_area_local;
  void *data_local;
  wchar_t oid_local;
  
  fmt._4_4_ = num_obj;
  wVar1 = (player->upkeep->quiver_cnt + (uint)z_info->quiver_slot_size + -1) /
          (int)(uint)z_info->quiver_slot_size;
  text_out_hook = text_out_to_screen;
  text_out_wrap = L'\0';
  text_out_indent = param_3->col + L'\xffffffff';
  text_out_pad = L'\x01';
  if (param_3->col + L'\xffffffff' < 1) {
    local_9c = L'\0';
  }
  else {
    local_9c = param_3->col + L'\xffffffff';
  }
  prt("",param_3->row + param_3->page_rows,local_9c);
  Term_gotoxy(param_3->col,param_3->row + param_3->page_rows);
  if (((olist_mode & OLIST_QUIVER) != OLIST_NONE) && (player->upkeep->command_wrk == L'\x02')) {
    for (quiver_slots = L'\0'; quiver_slots < wVar1; quiver_slots = quiver_slots + L'\x01') {
      if (quiver_slots == wVar1 + L'\xffffffff') {
        i = player->upkeep->quiver_cnt - (uint)z_info->quiver_slot_size * (wVar1 + L'\xffffffff');
      }
      else {
        i = (wchar_t)z_info->quiver_slot_size;
      }
      strnfmt((char *)&j,0x50,"%c) ",
              (ulong)(uint)(int)"abcdefgimnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ"[fmt._4_4_]);
      text_out_c('\x02',(char *)&j,(ulong)(uint)(param_3->row + fmt._4_4_),(ulong)(uint)param_3->col
                );
      pcVar2 = "s";
      if (i == L'\x01') {
        pcVar2 = "";
      }
      strnfmt((char *)&j,0x50,"in Quiver: %d missile%s\n",(ulong)(uint)i,pcVar2);
      text_out_c('\x0f',(char *)&j,(ulong)(uint)(param_3->row + fmt._4_4_),
                 (ulong)(uint)(param_3->col + L'\x03'));
      fmt._4_4_ = fmt._4_4_ + L'\x01';
    }
  }
  if (param_3->col + L'\xffffffff' < 1) {
    local_a4 = L'\0';
  }
  else {
    local_a4 = param_3->col + L'\xffffffff';
  }
  prt("",param_3->row + fmt._4_4_,local_a4);
  while( true ) {
    bVar3 = false;
    if (1 < tile_height) {
      bVar3 = (param_3->row + fmt._4_4_) % (int)(uint)tile_height != 0;
    }
    if (!bVar3) break;
    fmt._4_4_ = fmt._4_4_ + L'\x01';
    if (param_3->col + L'\xffffffff' < 1) {
      local_b0 = L'\0';
    }
    else {
      local_b0 = param_3->col + L'\xffffffff';
    }
    prt("",param_3->row + fmt._4_4_,local_b0);
  }
  text_out_pad = L'\0';
  text_out_indent = L'\0';
  return;
}

Assistant:

static void item_menu_browser(int oid, void *data, const region *local_area)
{
	char tmp_val[80];
	int count, j, i = num_obj;
	int quiver_slots = (player->upkeep->quiver_cnt + z_info->quiver_slot_size - 1)
		/ z_info->quiver_slot_size;

	/* Set up to output below the menu */
	text_out_hook = text_out_to_screen;
	text_out_wrap = 0;
	text_out_indent = local_area->col - 1;
	text_out_pad = 1;
	prt("", local_area->row + local_area->page_rows, MAX(0, local_area->col - 1));
	Term_gotoxy(local_area->col, local_area->row + local_area->page_rows);

	/* If we're printing pack slots the quiver takes up */
	if (olist_mode & OLIST_QUIVER && player->upkeep->command_wrk == USE_INVEN) {
		/* Quiver may take multiple lines */
		for (j = 0; j < quiver_slots; j++, i++) {
			const char *fmt = "in Quiver: %d missile%s\n";
			char letter = all_letters_nohjkl[i];

			/* Number of missiles in this "slot" */
			if (j == quiver_slots - 1)
				count = player->upkeep->quiver_cnt - (z_info->quiver_slot_size *
													  (quiver_slots - 1));
			else
				count = z_info->quiver_slot_size;

			/* Print the (disabled) label */
			strnfmt(tmp_val, sizeof(tmp_val), "%c) ", letter);
			text_out_c(COLOUR_SLATE, tmp_val, local_area->row + i, local_area->col);

			/* Print the count */
			strnfmt(tmp_val, sizeof(tmp_val), fmt, count,
					count == 1 ? "" : "s");
			text_out_c(COLOUR_L_UMBER, tmp_val, local_area->row + i, local_area->col + 3);
		}
	}

	/* Always print a blank line */
	prt("", local_area->row + i, MAX(0, local_area->col - 1));

	/* Blank out whole tiles */
	while ((tile_height > 1) && ((local_area->row + i) % tile_height != 0)) {
		i++;
		prt("", local_area->row + i, MAX(0, local_area->col - 1));
	}

	text_out_pad = 0;
	text_out_indent = 0;
}